

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86emithelper.cpp
# Opt level: O3

Error asmjit::_abi_1_10::x86::Emitter_emitProlog(BaseEmitter *emitter,FuncFrame *frame)

{
  Error EVar1;
  EmitHelper emitHelper;
  EmitHelper local_18;
  
  local_18._avx512Enabled = (bool)((byte)(frame->_attributes >> 0x11) & 1);
  local_18.super_BaseEmitHelper._vptr_BaseEmitHelper = (_func_int **)&PTR_emitRegMove_00170bd0;
  local_18._avxEnabled =
       (frame->_attributes & (kX86_AVX512Enabled|kX86_AVXEnabled)) != kNoAttributes;
  local_18.super_BaseEmitHelper._emitter = emitter;
  EVar1 = EmitHelper::emitProlog(&local_18,frame);
  return EVar1;
}

Assistant:

static Error ASMJIT_CDECL Emitter_emitProlog(BaseEmitter* emitter, const FuncFrame& frame) {
  EmitHelper emitHelper(emitter, frame.isAvxEnabled(), frame.isAvx512Enabled());
  return emitHelper.emitProlog(frame);
}